

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

Reference * __thiscall
czh::parser::Parser::parse_ref(Reference *__return_storage_ptr__,Parser *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  Token local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  source_location local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  const_iterator local_88;
  byte local_7e;
  undefined1 local_7d;
  bool id;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  Parser *this_local;
  
  path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_40 + 0x10));
  if ((this->curr_tok).type == REF) {
    local_7d = 1;
    local_68 = &local_60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_69);
    local_7d = 0;
    local_40._0_8_ = &local_60;
    local_40._8_8_ = 1;
    __l._M_len = 1;
    __l._M_array = (iterator)local_40._0_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_40 + 0x10),__l);
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
    do {
      local_158 = local_158 + -1;
      std::__cxx11::string::~string((string *)local_158);
    } while (local_158 != &local_60);
    std::allocator<char>::~allocator(&local_69);
  }
  local_7e = 0;
  while( true ) {
    bVar1 = true;
    if ((this->curr_tok).type != ID) {
      bVar1 = (this->curr_tok).type == REF;
    }
    if (!bVar1) break;
    if ((this->curr_tok).type == ID) {
      if ((local_7e & 1) != 0) break;
      local_90._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_40 + 0x10));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_88,&local_90);
      local_b8._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00277230;
      czh::value::Value::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                (&local_b0,&(this->curr_tok).what,&local_b8);
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_40 + 0x10),local_88,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      local_7e = 1;
    }
    else {
      local_7e = 0;
    }
    get(&local_110,this);
    czh::token::Token::operator=(&this->curr_tok,&local_110);
    czh::token::Token::~Token(&local_110);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_128,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_40 + 0x10));
  czh::value::Reference::Reference(__return_storage_ptr__,&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_40 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

value::Reference parse_ref()
    {
      std::vector<std::string> path;
      if (curr_tok.type == token::TokenType::REF)
      {
        path = {""};
      }
      bool id = false;
      while (curr_tok.type == token::TokenType::ID || curr_tok.type == token::TokenType::REF)
      {
        if (curr_tok.type == token::TokenType::ID)
        {
          if (id) break;// double id
          path.insert(path.begin(), curr_tok.what.get<std::string>());
          id = true;
        }
        else
        {
          id = false;
        }
        curr_tok = get();
      }
      return {path};
    }